

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmList.cxx
# Opt level: O1

iterator cmList::Insert(container_type *container,const_iterator pos,string *value,
                       ExpandElements expandElements,EmptyElements emptyElements)

{
  byte *pbVar1;
  byte *pbVar2;
  byte bVar3;
  pointer pbVar4;
  long lVar5;
  iterator iVar6;
  int iVar7;
  byte *pbVar8;
  const_iterator __position;
  string newValue;
  byte *local_68;
  value_type local_58;
  container_type *local_38;
  
  pbVar4 = (container->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (expandElements == Yes) {
    if ((emptyElements == No) && (value->_M_string_length == 0)) {
      return (iterator)pos._M_current;
    }
    lVar5 = std::__cxx11::string::find((char)value,0x3b);
    if (lVar5 == -1) {
LAB_002cd7f7:
      iVar6 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::_M_insert_rval(container,pos,value);
      return (iterator)iVar6._M_current;
    }
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    local_58._M_string_length = 0;
    local_58.field_2._M_local_buf[0] = '\0';
    pbVar8 = (byte *)(value->_M_dataplus)._M_p;
    pbVar2 = pbVar8 + value->_M_string_length;
    __position._M_current = pos._M_current;
    local_68 = pbVar8;
    local_38 = container;
    if (value->_M_string_length != 0) {
      iVar7 = 0;
      do {
        bVar3 = *pbVar8;
        if (bVar3 < 0x5c) {
          if (bVar3 == 0x3b) {
            if (iVar7 == 0) {
              std::__cxx11::string::replace
                        ((ulong)&local_58,local_58._M_string_length,(char *)0x0,(ulong)local_68);
              local_68 = pbVar8 + 1;
              if ((emptyElements == Yes) || (iVar7 = 0, local_58._M_string_length != 0)) {
                iVar6 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::insert(local_38,__position,&local_58);
                __position._M_current = iVar6._M_current + 1;
                local_58._M_string_length = 0;
                *local_58._M_dataplus._M_p = '\0';
                iVar7 = 0;
              }
            }
          }
          else if (bVar3 == 0x5b) {
            iVar7 = iVar7 + 1;
          }
        }
        else if (bVar3 == 0x5d) {
          iVar7 = iVar7 + -1;
        }
        else if (((bVar3 == 0x5c) && (pbVar1 = pbVar8 + 1, pbVar1 != pbVar2)) && (*pbVar1 == 0x3b))
        {
          std::__cxx11::string::replace
                    ((ulong)&local_58,local_58._M_string_length,(char *)0x0,(ulong)local_68);
          pbVar8 = pbVar1;
          local_68 = pbVar1;
        }
        pbVar8 = pbVar8 + 1;
      } while (pbVar8 != pbVar2);
    }
    std::__cxx11::string::replace
              ((ulong)&local_58,local_58._M_string_length,(char *)0x0,(ulong)local_68);
    container = local_38;
    if ((emptyElements == Yes) || (local_58._M_string_length != 0)) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_insert_rval(local_38,__position,&local_58);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,
                      CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                               local_58.field_2._M_local_buf[0]) + 1);
    }
  }
  else if ((emptyElements == Yes) || (value->_M_string_length != 0)) goto LAB_002cd7f7;
  return (iterator)
         (pos._M_current +
         ((long)(container->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start - (long)pbVar4));
}

Assistant:

cmList::container_type::iterator cmList::Insert(
  container_type& container, container_type::const_iterator pos,
  std::string&& value, ExpandElements expandElements,
  EmptyElements emptyElements)
{
  auto delta = std::distance(container.cbegin(), pos);
  auto insertPos = container.begin() + delta;

  if (expandElements == ExpandElements::Yes) {
    // If argument is empty, it is an empty list.
    if (emptyElements == EmptyElements::No && value.empty()) {
      return insertPos;
    }

    // if there are no ; in the name then just copy the current string
    if (value.find(';') == std::string::npos) {
      return container.insert(insertPos, std::move(value));
    }

    std::string newValue;
    // Break the string at non-escaped semicolons not nested in [].
    int squareNesting = 0;
    auto last = value.begin();
    auto const cend = value.end();
    for (auto c = last; c != cend; ++c) {
      switch (*c) {
        case '\\': {
          // We only want to allow escaping of semicolons.  Other
          // escapes should not be processed here.
          auto cnext = c + 1;
          if ((cnext != cend) && *cnext == ';') {
            newValue.append(last, c);
            // Skip over the escape character
            last = cnext;
            c = cnext;
          }
        } break;
        case '[': {
          ++squareNesting;
        } break;
        case ']': {
          --squareNesting;
        } break;
        case ';': {
          // brackets.
          if (squareNesting == 0) {
            newValue.append(last, c);
            // Skip over the semicolon
            last = c + 1;
            if (!newValue.empty() || emptyElements == EmptyElements::Yes) {
              // Add the last argument.
              insertPos = container.insert(insertPos, newValue);
              insertPos++;
              newValue.clear();
            }
          }
        } break;
        default: {
          // Just append this character.
        } break;
      }
    }
    newValue.append(last, cend);
    if (!newValue.empty() || emptyElements == EmptyElements::Yes) {
      // Add the last argument.
      container.insert(insertPos, std::move(newValue));
    }
  } else if (!value.empty() || emptyElements == EmptyElements::Yes) {
    return container.insert(insertPos, std::move(value));
  }
  return container.begin() + delta;
}